

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

void Cmd_Init(Abc_Frame_t *pAbc)

{
  st__table *psVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  psVar1 = st__init_table(strcmp,st__strhash);
  pAbc->tCommands = psVar1;
  psVar1 = st__init_table(strcmp,st__strhash);
  pAbc->tAliases = psVar1;
  psVar1 = st__init_table(strcmp,st__strhash);
  pAbc->tFlags = psVar1;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pAbc->aHistory = pVVar2;
  Cmd_HistoryRead(pAbc);
  Cmd_CommandAdd(pAbc,"Basic","time",CmdCommandTime,0);
  Cmd_CommandAdd(pAbc,"Basic","echo",CmdCommandEcho,0);
  Cmd_CommandAdd(pAbc,"Basic","quit",CmdCommandQuit,0);
  Cmd_CommandAdd(pAbc,"Basic","abcrc",CmdCommandAbcrc,0);
  Cmd_CommandAdd(pAbc,"Basic","history",CmdCommandHistory,0);
  Cmd_CommandAdd(pAbc,"Basic","alias",CmdCommandAlias,0);
  Cmd_CommandAdd(pAbc,"Basic","unalias",CmdCommandUnalias,0);
  Cmd_CommandAdd(pAbc,"Basic","help",CmdCommandHelp,0);
  Cmd_CommandAdd(pAbc,"Basic","source",CmdCommandSource,0);
  Cmd_CommandAdd(pAbc,"Basic","set",CmdCommandSetVariable,0);
  Cmd_CommandAdd(pAbc,"Basic","unset",CmdCommandUnsetVariable,0);
  Cmd_CommandAdd(pAbc,"Basic","undo",CmdCommandUndo,0);
  Cmd_CommandAdd(pAbc,"Basic","recall",CmdCommandRecall,0);
  Cmd_CommandAdd(pAbc,"Basic","empty",CmdCommandEmpty,0);
  Cmd_CommandAdd(pAbc,"Basic","version",CmdCommandVersion,0);
  Cmd_CommandAdd(pAbc,"Various","sis",CmdCommandSis,1);
  Cmd_CommandAdd(pAbc,"Various","mvsis",CmdCommandMvsis,1);
  Cmd_CommandAdd(pAbc,"Various","capo",CmdCommandCapo,0);
  Cmd_CommandAdd(pAbc,"Various","starter",CmdCommandStarter,0);
  Cmd_CommandAdd(pAbc,"Various","autotuner",CmdCommandAutoTuner,0);
  Cmd_CommandAdd(pAbc,"Various","load_plugin",Cmd_CommandAbcLoadPlugIn,0);
  return;
}

Assistant:

void Cmd_Init( Abc_Frame_t * pAbc )
{
    pAbc->tCommands = st__init_table(strcmp, st__strhash);
    pAbc->tAliases  = st__init_table(strcmp, st__strhash);
    pAbc->tFlags    = st__init_table(strcmp, st__strhash);
    pAbc->aHistory  = Vec_PtrAlloc( 100 );
    Cmd_HistoryRead( pAbc );

    Cmd_CommandAdd( pAbc, "Basic", "time",          CmdCommandTime,            0 );
    Cmd_CommandAdd( pAbc, "Basic", "echo",          CmdCommandEcho,            0 );
    Cmd_CommandAdd( pAbc, "Basic", "quit",          CmdCommandQuit,            0 );
    Cmd_CommandAdd( pAbc, "Basic", "abcrc",         CmdCommandAbcrc,           0 );
    Cmd_CommandAdd( pAbc, "Basic", "history",       CmdCommandHistory,         0 );
    Cmd_CommandAdd( pAbc, "Basic", "alias",         CmdCommandAlias,           0 );
    Cmd_CommandAdd( pAbc, "Basic", "unalias",       CmdCommandUnalias,         0 );
    Cmd_CommandAdd( pAbc, "Basic", "help",          CmdCommandHelp,            0 );
    Cmd_CommandAdd( pAbc, "Basic", "source",        CmdCommandSource,          0 );
    Cmd_CommandAdd( pAbc, "Basic", "set",           CmdCommandSetVariable,     0 );
    Cmd_CommandAdd( pAbc, "Basic", "unset",         CmdCommandUnsetVariable,   0 );
    Cmd_CommandAdd( pAbc, "Basic", "undo",          CmdCommandUndo,            0 );
    Cmd_CommandAdd( pAbc, "Basic", "recall",        CmdCommandRecall,          0 );
    Cmd_CommandAdd( pAbc, "Basic", "empty",         CmdCommandEmpty,           0 );
#if defined(WIN32) && !defined(__cplusplus)
    Cmd_CommandAdd( pAbc, "Basic", "scandir",       CmdCommandScanDir,         0 );
    Cmd_CommandAdd( pAbc, "Basic", "renamefiles",   CmdCommandRenameFiles,     0 );
    Cmd_CommandAdd( pAbc, "Basic", "ls",            CmdCommandLs,              0 );
    Cmd_CommandAdd( pAbc, "Basic", "scrgen",        CmdCommandScrGen,          0 );
#endif
    Cmd_CommandAdd( pAbc, "Basic", "version",       CmdCommandVersion,         0 );

    Cmd_CommandAdd( pAbc, "Various", "sis",         CmdCommandSis,             1 );
    Cmd_CommandAdd( pAbc, "Various", "mvsis",       CmdCommandMvsis,           1 );
    Cmd_CommandAdd( pAbc, "Various", "capo",        CmdCommandCapo,            0 );
    Cmd_CommandAdd( pAbc, "Various", "starter",     CmdCommandStarter,         0 );
    Cmd_CommandAdd( pAbc, "Various", "autotuner",   CmdCommandAutoTuner,       0 );

    Cmd_CommandAdd( pAbc, "Various", "load_plugin", Cmd_CommandAbcLoadPlugIn,  0 );
}